

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O3

bool __thiscall
OpenMD::EqualIgnoreCaseConstraint::operator()(EqualIgnoreCaseConstraint *this,string *data)

{
  int iVar1;
  locale *in_RCX;
  bool bVar2;
  undefined1 auStack_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  std::locale::locale((locale *)auStack_48);
  toUpperCopy<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(auStack_48 + 8),
             (OpenMD *)data,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_48,in_RCX)
  ;
  if (local_38._M_allocated_capacity == (this->rhs_)._M_string_length) {
    if (local_38._M_allocated_capacity == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((void *)auStack_48._8_8_,(this->rhs_)._M_dataplus._M_p,
                   local_38._M_allocated_capacity);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((char *)auStack_48._8_8_ != local_38._M_local_buf + 8) {
    operator_delete((void *)auStack_48._8_8_,local_38._8_8_ + 1);
  }
  std::locale::~locale((locale *)auStack_48);
  return bVar2;
}

Assistant:

bool operator()(std::string data) const {
      return OpenMD::toUpperCopy(data) == rhs_;
    }